

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

int __thiscall QSslSocket::close(QSslSocket *this,int __fd)

{
  bool bVar1;
  int extraout_EAX;
  QSslSocketPrivate *pQVar2;
  pointer pTVar3;
  qint64 qVar4;
  TlsCryptograph *backend;
  QSslSocketPrivate *d;
  QSslSocket *in_stack_ffffffffffffffd8;
  
  pQVar2 = d_func((QSslSocket *)0x3a1b3c);
  pTVar3 = std::
           unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
           ::get((unique_ptr<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
                  *)0x3a1b52);
  if (pTVar3 != (pointer)0x0) {
    (**(code **)(*(long *)pTVar3 + 0xb0))();
  }
  if ((((pQVar2->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.abortCalled & 1U) == 0) &&
     ((qVar4 = encryptedBytesToWrite(in_stack_ffffffffffffffd8), qVar4 != 0 ||
      (bVar1 = QIODevicePrivate::QRingBufferRef::isEmpty((QRingBufferRef *)this), !bVar1)))) {
    QAbstractSocket::flush((QAbstractSocket *)0x3a1baa);
  }
  if (pQVar2->plainSocket != (QTcpSocket *)0x0) {
    if (((pQVar2->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.abortCalled & 1U) == 0) {
      (**(code **)(*(long *)&pQVar2->plainSocket->super_QAbstractSocket + 0x70))();
    }
    else {
      QAbstractSocket::abort(&pQVar2->plainSocket->super_QAbstractSocket);
    }
  }
  QAbstractSocket::close((QAbstractSocket *)this,__fd);
  QIODevicePrivate::QRingBufferRef::clear((QRingBufferRef *)this);
  QIODevicePrivate::QRingBufferRef::clear((QRingBufferRef *)this);
  return extraout_EAX;
}

Assistant:

void QSslSocket::close()
{
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::close()";
#endif
    Q_D(QSslSocket);

    // On Windows, CertGetCertificateChain is probably still doing its
    // job, if the socket is re-used, we want to ignore its reported
    // root CA.
    if (auto *backend = d->backend.get())
        backend->cancelCAFetch();

    if (!d->abortCalled && (encryptedBytesToWrite() || !d->writeBuffer.isEmpty()))
        flush();
    if (d->plainSocket) {
        if (d->abortCalled)
            d->plainSocket->abort();
        else
            d->plainSocket->close();
    }
    QTcpSocket::close();

    // must be cleared, reading/writing not possible on closed socket:
    d->buffer.clear();
    d->writeBuffer.clear();
}